

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V5_dimstyle.cpp
# Opt level: O2

bool __thiscall ON_V5x_DimStyle::CompareFields(ON_V5x_DimStyle *this,ON_V5x_DimStyle *other)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  ON_Font *pOVar4;
  ON_UUID *a;
  ON_UUID *b;
  
  if ((this->m_extextension != other->m_extextension) ||
     (NAN(this->m_extextension) || NAN(other->m_extextension))) {
    return false;
  }
  if ((this->m_extoffset == other->m_extoffset) &&
     (!NAN(this->m_extoffset) && !NAN(other->m_extoffset))) {
    if ((this->m_arrowsize == other->m_arrowsize) &&
       (!NAN(this->m_arrowsize) && !NAN(other->m_arrowsize))) {
      if ((this->m_centermark == other->m_centermark) &&
         (!NAN(this->m_centermark) && !NAN(other->m_centermark))) {
        if ((this->m_textgap == other->m_textgap) &&
           (!NAN(this->m_textgap) && !NAN(other->m_textgap))) {
          if ((((this->m_textheight == other->m_textheight) &&
               (!NAN(this->m_textheight) && !NAN(other->m_textheight))) &&
              (this->m_dimstyle_textalign == other->m_dimstyle_textalign)) &&
             ((((this->m_arrowtype == other->m_arrowtype &&
                (this->m_angularunits == other->m_angularunits)) &&
               ((this->m_lengthformat == other->m_lengthformat &&
                ((this->m_angleformat == other->m_angleformat &&
                 (this->m_angleresolution == other->m_angleresolution)))))) &&
              (this->m_lengthresolution == other->m_lengthresolution)))) {
            pOVar4 = ON_TextStyle::Font(&this->m_v5_text_style);
            uVar2 = ON_Font::ManagedFontSerialNumber(pOVar4);
            pOVar4 = ON_TextStyle::Font(&other->m_v5_text_style);
            uVar3 = ON_Font::ManagedFontSerialNumber(pOVar4);
            if (uVar2 == uVar3) {
              if (((this->m_lengthfactor == other->m_lengthfactor) &&
                  (!NAN(this->m_lengthfactor) && !NAN(other->m_lengthfactor))) &&
                 (this->m_bAlternate == other->m_bAlternate)) {
                if (((this->m_alternate_lengthfactor == other->m_alternate_lengthfactor) &&
                    (!NAN(this->m_alternate_lengthfactor) && !NAN(other->m_alternate_lengthfactor)))
                   && ((((this->m_alternate_lengthformat == other->m_alternate_lengthformat &&
                         ((this->m_alternate_lengthresolution == other->m_alternate_lengthresolution
                          && (this->m_alternate_angleformat == other->m_alternate_angleformat)))) &&
                        (this->m_alternate_angleresolution == other->m_alternate_angleresolution))
                       && ((((bVar1 = ::operator!=(&this->m_prefix,&other->m_prefix), !bVar1 &&
                             (bVar1 = ::operator!=(&this->m_suffix,&other->m_suffix), !bVar1)) &&
                            (bVar1 = ::operator!=(&this->m_alternate_prefix,
                                                  &other->m_alternate_prefix), !bVar1)) &&
                           (bVar1 = ::operator!=(&this->m_alternate_suffix,
                                                 &other->m_alternate_suffix), !bVar1)))))) {
                  if ((this->m_dimextension == other->m_dimextension) &&
                     (!NAN(this->m_dimextension) && !NAN(other->m_dimextension))) {
                    if (((this->m_leaderarrowsize == other->m_leaderarrowsize) &&
                        ((!NAN(this->m_leaderarrowsize) && !NAN(other->m_leaderarrowsize) &&
                         (this->m_leaderarrowtype == other->m_leaderarrowtype)))) &&
                       ((this->m_bSuppressExtension1 == other->m_bSuppressExtension1 &&
                        (this->m_bSuppressExtension2 == other->m_bSuppressExtension2)))) {
                      a = ON_ModelComponent::ParentId(&this->super_ON_ModelComponent);
                      b = ON_ModelComponent::ParentId(&other->super_ON_ModelComponent);
                      bVar1 = ::operator!=(a,b);
                      if (((!bVar1) && (this->m_tolerance_style == other->m_tolerance_style)) &&
                         (this->m_tolerance_resolution == other->m_tolerance_resolution)) {
                        if ((this->m_tolerance_upper_value == other->m_tolerance_upper_value) &&
                           (!NAN(this->m_tolerance_upper_value) &&
                            !NAN(other->m_tolerance_upper_value))) {
                          if ((this->m_tolerance_lower_value == other->m_tolerance_lower_value) &&
                             (!NAN(this->m_tolerance_lower_value) &&
                              !NAN(other->m_tolerance_lower_value))) {
                            if ((this->m_tolerance_height_scale == other->m_tolerance_height_scale)
                               && (!NAN(this->m_tolerance_height_scale) &&
                                   !NAN(other->m_tolerance_height_scale))) {
                              if ((this->m_baseline_spacing == other->m_baseline_spacing) &&
                                 (((!NAN(this->m_baseline_spacing) &&
                                    !NAN(other->m_baseline_spacing) &&
                                   (this->m_bDrawMask == other->m_bDrawMask)) &&
                                  (this->m_mask_color_source == other->m_mask_color_source)))) {
                                uVar2 = ON_Color::operator_cast_to_unsigned_int(&this->m_mask_color)
                                ;
                                uVar3 = ON_Color::operator_cast_to_unsigned_int
                                                  (&other->m_mask_color);
                                if (uVar2 == uVar3) {
                                  if ((((this->m_dimscale == other->m_dimscale) &&
                                       (!NAN(this->m_dimscale) && !NAN(other->m_dimscale))) &&
                                      ((this->m_dimscale_source == other->m_dimscale_source &&
                                       ((this->m_ext_line_color_source ==
                                         other->m_ext_line_color_source &&
                                        (this->m_dim_line_color_source ==
                                         other->m_dim_line_color_source)))))) &&
                                     ((this->m_arrow_color_source == other->m_arrow_color_source &&
                                      (this->m_text_color_source == other->m_text_color_source)))) {
                                    uVar2 = ON_Color::operator_cast_to_unsigned_int
                                                      (&this->m_ext_line_color);
                                    uVar3 = ON_Color::operator_cast_to_unsigned_int
                                                      (&other->m_ext_line_color);
                                    if (uVar2 == uVar3) {
                                      uVar2 = ON_Color::operator_cast_to_unsigned_int
                                                        (&this->m_dim_line_color);
                                      uVar3 = ON_Color::operator_cast_to_unsigned_int
                                                        (&other->m_dim_line_color);
                                      if (uVar2 == uVar3) {
                                        uVar2 = ON_Color::operator_cast_to_unsigned_int
                                                          (&this->m_arrow_color);
                                        uVar3 = ON_Color::operator_cast_to_unsigned_int
                                                          (&other->m_arrow_color);
                                        if (uVar2 == uVar3) {
                                          uVar2 = ON_Color::operator_cast_to_unsigned_int
                                                            (&this->m_text_color);
                                          uVar3 = ON_Color::operator_cast_to_unsigned_int
                                                            (&other->m_text_color);
                                          if ((((uVar2 == uVar3) &&
                                               (this->m_ext_line_plot_color_source ==
                                                other->m_ext_line_plot_color_source)) &&
                                              (this->m_dim_line_plot_color_source ==
                                               other->m_dim_line_plot_color_source)) &&
                                             ((this->m_arrow_plot_color_source ==
                                               other->m_arrow_plot_color_source &&
                                              (this->m_text_plot_color_source ==
                                               other->m_text_plot_color_source)))) {
                                            uVar2 = ON_Color::operator_cast_to_unsigned_int
                                                              (&this->m_ext_line_plot_color);
                                            uVar3 = ON_Color::operator_cast_to_unsigned_int
                                                              (&other->m_ext_line_plot_color);
                                            if (uVar2 == uVar3) {
                                              uVar2 = ON_Color::operator_cast_to_unsigned_int
                                                                (&this->m_dim_line_plot_color);
                                              uVar3 = ON_Color::operator_cast_to_unsigned_int
                                                                (&other->m_dim_line_plot_color);
                                              if (uVar2 == uVar3) {
                                                uVar2 = ON_Color::operator_cast_to_unsigned_int
                                                                  (&this->m_arrow_plot_color);
                                                uVar3 = ON_Color::operator_cast_to_unsigned_int
                                                                  (&other->m_arrow_plot_color);
                                                if (uVar2 == uVar3) {
                                                  uVar2 = ON_Color::operator_cast_to_unsigned_int
                                                                    (&this->m_text_plot_color);
                                                  uVar3 = ON_Color::operator_cast_to_unsigned_int
                                                                    (&other->m_text_plot_color);
                                                  if (((uVar2 == uVar3) &&
                                                      (this->m_ext_line_plot_weight_source ==
                                                       other->m_ext_line_plot_weight_source)) &&
                                                     (this->m_dim_line_plot_weight_source ==
                                                      other->m_dim_line_plot_weight_source)) {
                                                    if ((this->m_ext_line_plot_weight_mm ==
                                                         other->m_ext_line_plot_weight_mm) &&
                                                       (!NAN(this->m_ext_line_plot_weight_mm) &&
                                                        !NAN(other->m_ext_line_plot_weight_mm))) {
                                                      if ((this->m_dim_line_plot_weight_mm ==
                                                           other->m_dim_line_plot_weight_mm) &&
                                                         (!NAN(this->m_dim_line_plot_weight_mm) &&
                                                          !NAN(other->m_dim_line_plot_weight_mm))) {
                                                        if (((this->m_fixed_extension_len ==
                                                              other->m_fixed_extension_len) &&
                                                            (!NAN(this->m_fixed_extension_len) &&
                                                             !NAN(other->m_fixed_extension_len))) &&
                                                           (this->m_fixed_extension_len_on ==
                                                            other->m_fixed_extension_len_on)) {
                                                          if ((((this->m_text_rotation ==
                                                                 other->m_text_rotation) &&
                                                               (!NAN(this->m_text_rotation) &&
                                                                !NAN(other->m_text_rotation))) &&
                                                              (this->m_alt_tol_resolution ==
                                                               other->m_alt_tol_resolution)) &&
                                                             (((this->m_suppress_arrow1 ==
                                                                other->m_suppress_arrow1 &&
                                                               (this->m_suppress_arrow2 ==
                                                                other->m_suppress_arrow2)) &&
                                                              ((this->m_textmove_leader ==
                                                                other->m_textmove_leader &&
                                                               (this->m_arclength_sym ==
                                                                other->m_arclength_sym)))))) {
                                                            if (((this->m_stack_textheight_fraction
                                                                  == other->
                                                  m_stack_textheight_fraction) &&
                                                  (!NAN(this->m_stack_textheight_fraction) &&
                                                   !NAN(other->m_stack_textheight_fraction))) &&
                                                  (this->m_stack_format == other->m_stack_format)) {
                                                    if ((this->m_alt_round == other->m_alt_round) &&
                                                       (!NAN(this->m_alt_round) &&
                                                        !NAN(other->m_alt_round))) {
                                                      if ((this->m_round == other->m_round) &&
                                                         (((!NAN(this->m_round) &&
                                                            !NAN(other->m_round) &&
                                                           (this->m_alt_zero_suppress ==
                                                            other->m_alt_zero_suppress)) &&
                                                          ((this->m_tol_zero_suppress ==
                                                            other->m_tol_zero_suppress &&
                                                           (((this->m_zero_suppress ==
                                                              other->m_zero_suppress &&
                                                             (this->m_ang_zero_suppress ==
                                                              other->m_ang_zero_suppress)) &&
                                                            (bVar1 = ON_Arrowhead::operator!=
                                                                               (&this->m_arrow_1,
                                                                                &other->m_arrow_1),
                                                            !bVar1)))))))) {
                                                        bVar1 = ON_Arrowhead::operator!=
                                                                          (&this->m_arrow_2,
                                                                           &other->m_arrow_2);
                                                        return !bVar1;
                                                      }
                                                    }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool ON_V5x_DimStyle::CompareFields(const ON_V5x_DimStyle& other) const
{
  if(
    (m_extextension != other.m_extextension) ||
    (m_extoffset != other.m_extoffset) ||
    (m_arrowsize != other.m_arrowsize) ||
    (m_centermark != other.m_centermark) ||
    (m_textgap != other.m_textgap) ||
    (m_textheight != other.m_textheight) ||
    (m_dimstyle_textalign != other.m_dimstyle_textalign) ||
    (m_arrowtype != other.m_arrowtype) ||
    (m_angularunits != other.m_angularunits) ||
    (m_lengthformat != other.m_lengthformat) ||
    (m_angleformat != other.m_angleformat) ||
    (m_angleresolution != other.m_angleresolution) ||
    (m_lengthresolution != other.m_lengthresolution) ||
    (m_v5_text_style.Font().ManagedFontSerialNumber() != other.m_v5_text_style.Font().ManagedFontSerialNumber()) ||
    (m_lengthfactor != other.m_lengthfactor) ||
    (m_bAlternate != other.m_bAlternate) ||
    (m_alternate_lengthfactor != other.m_alternate_lengthfactor) ||
    (m_alternate_lengthformat != other.m_alternate_lengthformat) ||
    (m_alternate_lengthresolution != other.m_alternate_lengthresolution) ||
    (m_alternate_angleformat != other.m_alternate_angleformat) ||
    (m_alternate_angleresolution != other.m_alternate_angleresolution) ||
    (m_prefix != other.m_prefix) ||
    (m_suffix != other.m_suffix) ||
    (m_alternate_prefix != other.m_alternate_prefix) ||
    (m_alternate_suffix != other.m_alternate_suffix) ||
    (m_dimextension != other.m_dimextension) ||
    (m_leaderarrowsize != other.m_leaderarrowsize) ||
    (m_leaderarrowtype != other.m_leaderarrowtype) ||
    (m_bSuppressExtension1 != other.m_bSuppressExtension1) ||
    (m_bSuppressExtension2 != other.m_bSuppressExtension2) ||
    (ParentId() != other.ParentId()) ||
    (m_tolerance_style != other.m_tolerance_style) ||
    (m_tolerance_resolution != other.m_tolerance_resolution) ||
    (m_tolerance_upper_value != other.m_tolerance_upper_value) ||
    (m_tolerance_lower_value != other.m_tolerance_lower_value) ||
    (m_tolerance_height_scale != other.m_tolerance_height_scale) ||
    (m_baseline_spacing != other.m_baseline_spacing) ||
    (m_bDrawMask != other.m_bDrawMask) ||
    (m_mask_color_source != other.m_mask_color_source) ||
    (m_mask_color != other.m_mask_color) ||
    (m_dimscale != other.m_dimscale) ||
    (m_dimscale_source != other.m_dimscale_source) 

    ||
    (m_ext_line_color_source != other.m_ext_line_color_source) ||
    (m_dim_line_color_source != other.m_dim_line_color_source) ||
    (m_arrow_color_source != other.m_arrow_color_source) ||
    (m_text_color_source != other.m_text_color_source) ||
    (m_ext_line_color != other.m_ext_line_color) ||
    (m_dim_line_color != other.m_dim_line_color) ||
    (m_arrow_color != other.m_arrow_color) ||
    (m_text_color != other.m_text_color) ||
    (m_ext_line_plot_color_source != other.m_ext_line_plot_color_source) ||
    (m_dim_line_plot_color_source != other.m_dim_line_plot_color_source) ||
    (m_arrow_plot_color_source != other.m_arrow_plot_color_source) ||
    (m_text_plot_color_source != other.m_text_plot_color_source) ||
    (m_ext_line_plot_color != other.m_ext_line_plot_color) ||
    (m_dim_line_plot_color != other.m_dim_line_plot_color) ||
    (m_arrow_plot_color != other.m_arrow_plot_color) ||
    (m_text_plot_color != other.m_text_plot_color) ||
    (m_ext_line_plot_weight_source != other.m_ext_line_plot_weight_source) ||
    (m_dim_line_plot_weight_source != other.m_dim_line_plot_weight_source) ||
    (m_ext_line_plot_weight_mm != other.m_ext_line_plot_weight_mm) ||
    (m_dim_line_plot_weight_mm != other.m_dim_line_plot_weight_mm) ||
    (m_fixed_extension_len != other.m_fixed_extension_len) ||
    (m_fixed_extension_len_on != other.m_fixed_extension_len_on) ||
    (m_text_rotation != other.m_text_rotation) ||
    (m_alt_tol_resolution != other.m_alt_tol_resolution) ||
    (m_suppress_arrow1 != other.m_suppress_arrow1) ||
    (m_suppress_arrow2 != other.m_suppress_arrow2) ||
    (m_textmove_leader != other.m_textmove_leader) ||
    (m_arclength_sym != other.m_arclength_sym) ||
    (m_stack_textheight_fraction != other.m_stack_textheight_fraction) ||
    (m_stack_format != other.m_stack_format) ||
    (m_alt_round != other.m_alt_round) ||
    (m_round != other.m_round) ||
    (m_alt_zero_suppress != other.m_alt_zero_suppress) ||
    (m_tol_zero_suppress != other.m_tol_zero_suppress) ||
    (m_zero_suppress != other.m_zero_suppress) ||
    (m_ang_zero_suppress != other.m_ang_zero_suppress) ||
    (m_arrow_1 != other.m_arrow_1) ||
    (m_arrow_2 != other.m_arrow_2)

    )
    return false;
  
  return true;
}